

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median-sorted.cpp
# Opt level: O3

double findMedianSortedArrays
                 (vector<int,_std::allocator<int>_> *A,vector<int,_std::allocator<int>_> *B)

{
  pointer piVar1;
  pointer piVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  char local_39;
  vector<int,_std::allocator<int>_> *local_38;
  
  piVar1 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar14 = (long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar2;
  iVar13 = (int)(uVar14 >> 2);
  iVar12 = (int)((ulong)((long)(A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  iVar5 = ((int)(((uint)(uVar14 >> 0x21) & 1) + iVar13) >> 1) + iVar12 + -1;
  if (iVar5 < 1) {
    lVar15 = -1;
    lVar6 = -1;
  }
  else {
    iVar7 = 0;
    iVar9 = 0;
    do {
      iVar10 = piVar1[iVar9];
      iVar11 = piVar2[iVar7];
      iVar8 = iVar7;
      if (iVar10 < iVar11) {
        if (iVar9 < iVar12 + -1) {
          iVar10 = piVar1[(long)iVar9 + 1];
          iVar9 = iVar9 + 1;
        }
        else {
          iVar8 = iVar7 + 1;
          iVar11 = piVar2[(long)iVar7 + 1];
        }
      }
      iVar7 = iVar8;
      if (iVar11 <= iVar10) {
        if (iVar8 < iVar13 + -1) {
          iVar7 = iVar8 + 1;
        }
        else {
          iVar9 = iVar9 + 1;
        }
      }
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    lVar15 = (long)(iVar9 + -1);
    lVar6 = (long)(iVar7 + -1);
  }
  local_38 = A;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar1[lVar15]);
  local_39 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
  plVar4 = (long *)std::ostream::operator<<
                             (poVar3,(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start[lVar6]);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar5 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar15];
  if ((iVar13 + iVar12 & 0x80000001U) == 1) {
    iVar12 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar6];
    if (iVar5 < iVar12) {
      dVar16 = (double)iVar5;
    }
    else {
      dVar16 = (double)iVar12;
    }
  }
  else {
    dVar16 = ((double)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6] + (double)iVar5) * 0.5;
  }
  return dVar16;
}

Assistant:

double findMedianSortedArrays(const vector<int> &A, const vector<int> &B) {

  int lA = A.size();
  int lB = B.size();
  int medPos = (lA + lB / 2) - 1;
  int a = 0, b = 0 , c = 0;
  while (c < medPos) {
    if (A[a] < B[b]) {
      if (a < lA - 1) a++;
      else b++;
    }
    if (A[a] >= B[b]) {
      if (b < lB - 1) b++;
      else a++;
    }
    c++;
  }
  cout<<A[a-1]<<' '<<B[b-1]<<endl;

  if ((lA + lB) % 2 == 1) {
    if (A[a-1] < B[b-1]) return A[a-1];
    else return B[b-1];
  } else {
    return (((double)A[a-1]) + ((double)B[b-1])) / 2;
  }
}